

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

int uv_poll_start(uv_poll_t *handle,int pevents,uv_poll_cb poll_cb)

{
  uint uVar1;
  uv_loop_t *in_RDX;
  uint in_ESI;
  long in_RDI;
  int events;
  undefined4 in_stack_ffffffffffffffd8;
  
  if ((in_ESI & 0xfffffffc) != 0) {
    __assert_fail("(pevents & ~(UV_READABLE | UV_WRITABLE)) == 0","src/unix/poll.c",0x53,
                  "int uv_poll_start(uv_poll_t *, int, uv_poll_cb)");
  }
  if ((*(uint *)(in_RDI + 0x30) & 3) != 0) {
    __assert_fail("!(handle->flags & (UV_CLOSING | UV_CLOSED))","src/unix/poll.c",0x54,
                  "int uv_poll_start(uv_poll_t *, int, uv_poll_cb)");
  }
  uv__poll_stop((uv_poll_t *)0x1129ba);
  if (in_ESI != 0) {
    uVar1 = (uint)((in_ESI & 1) != 0);
    if ((in_ESI & 2) != 0) {
      uVar1 = uVar1 | 4;
    }
    uv__io_start(in_RDX,(uv__io_t *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),0);
    if (((*(uint *)(in_RDI + 0x30) & 0x4000) == 0) &&
       (*(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) | 0x4000,
       (*(uint *)(in_RDI + 0x30) & 0x2000) != 0)) {
      *(int *)(*(long *)(in_RDI + 0x10) + 8) = *(int *)(*(long *)(in_RDI + 0x10) + 8) + 1;
    }
    *(uv_loop_t **)(in_RDI + 0x40) = in_RDX;
  }
  return 0;
}

Assistant:

int uv_poll_start(uv_poll_t* handle, int pevents, uv_poll_cb poll_cb) {
  int events;

  assert((pevents & ~(UV_READABLE | UV_WRITABLE)) == 0);
  assert(!(handle->flags & (UV_CLOSING | UV_CLOSED)));

  uv__poll_stop(handle);

  if (pevents == 0)
    return 0;

  events = 0;
  if (pevents & UV_READABLE)
    events |= UV__POLLIN;
  if (pevents & UV_WRITABLE)
    events |= UV__POLLOUT;

  uv__io_start(handle->loop, &handle->io_watcher, events);
  uv__handle_start(handle);
  handle->poll_cb = poll_cb;

  return 0;
}